

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O2

void __thiscall libDAI::TRW::calcNewMessage(TRW *this,size_t iI)

{
  size_t i;
  size_t I;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar2;
  undefined4 extraout_var_02;
  VarSet *pVVar3;
  long lVar4;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t j;
  undefined4 extraout_var_05;
  TFactor<double> *this_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Prob *pPVar5;
  undefined4 extraout_var_09;
  size_t j_00;
  undefined4 extraout_var_10;
  Var *n;
  Exception *pEVar6;
  size_t *psVar7;
  double dVar8;
  string local_178;
  Var v_j;
  VarSet v_J;
  TProb<double> local_120;
  Prob prod_j;
  Factor prod;
  Var v_k;
  Var v_i;
  VarSet v_I;
  VarSet local_50;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  i = *(size_t *)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x40) + iI * 0x10);
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  I = *(size_t *)(*(long *)(CONCAT44(extraout_var_00,iVar1) + 0x40) + 8 + iI * 0x10);
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  plVar2 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x30))
                             ((long *)CONCAT44(extraout_var_01,iVar1),i);
  v_i._label = *plVar2;
  v_i._states = plVar2[1];
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  pVVar3 = (VarSet *)
           (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x50))
                     ((long *)CONCAT44(extraout_var_02,iVar1),I);
  VarSet::VarSet(&v_I,pVVar3);
  lVar4 = (long)v_I._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v_I._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  if (lVar4 == 2) {
    VarSet::VarSet(&v_J,&v_i);
    VarSet::operator/(&prod._vs,&v_I,&v_J);
    v_j._label = (prod._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_start)->_label;
    v_j._states = (prod._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start)->_states;
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&prod);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&v_J);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    j = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar1) + 0x40))
                  ((long *)CONCAT44(extraout_var_04,iVar1),&v_j);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    this_00 = (TFactor<double> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar1) + 0x50))
                        ((long *)CONCAT44(extraout_var_05,iVar1),I);
    dVar8 = rho(this,i,j);
    TFactor<double>::operator^(&prod,this_00,1.0 / dVar8);
    TProb<double>::TProb(&prod_j,v_j._states);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    psVar7 = *(size_t **)(*(long *)(CONCAT44(extraout_var_06,iVar1) + 0x70) + j * 0x18);
    while( true ) {
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if (psVar7 == *(size_t **)(*(long *)(CONCAT44(extraout_var_07,iVar1) + 0x70) + 8 + j * 0x18))
      break;
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      pVVar3 = (VarSet *)
               (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar1) + 0x50))
                         ((long *)CONCAT44(extraout_var_08,iVar1),*psVar7);
      VarSet::VarSet(&v_J,pVVar3);
      lVar4 = (long)v_J._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)v_J._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4;
      if (lVar4 == 2) {
        VarSet::VarSet(&local_50,&v_j);
        VarSet::operator/((VarSet *)&local_178,&v_J,&local_50);
        v_k._label = *(long *)local_178._M_dataplus._M_p;
        v_k._states = *(size_t *)(local_178._M_dataplus._M_p + 8);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_178);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_50);
        iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        j_00 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar1) + 0x40))
                         ((long *)CONCAT44(extraout_var_09,iVar1),&v_k);
        if (*psVar7 == I) {
          pPVar5 = message(this,j,I);
          dVar8 = rho(this,j,j_00);
          TProb<double>::operator^((TProb<double> *)&local_178,pPVar5,dVar8 + -1.0);
        }
        else {
          pPVar5 = message(this,j,*psVar7);
          dVar8 = rho(this,j,j_00);
          TProb<double>::operator^((TProb<double> *)&local_178,pPVar5,dVar8);
        }
        TProb<double>::operator*=(&prod_j,(TProb<double> *)&local_178);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&local_178);
      }
      else {
        if (lVar4 != 1) {
          pEVar6 = (Exception *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"trw.cpp, line 197",(allocator<char> *)&local_50);
          Exception::Exception(pEVar6,0,&local_178);
          __cxa_throw(pEVar6,&Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        pPVar5 = message(this,j,*psVar7);
        TProb<double>::operator*=(&prod_j,pPVar5);
      }
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&v_J);
      psVar7 = psVar7 + 1;
    }
    VarSet::VarSet((VarSet *)&local_178,&v_j);
    TFactor<double>::TFactor((TFactor<double> *)&v_J,(VarSet *)&local_178,&prod_j);
    TFactor<double>::operator*=(&prod,(TFactor<double> *)&v_J);
    TFactor<double>::~TFactor((TFactor<double> *)&v_J);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_178);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar1) + 0x30))
                         ((long *)CONCAT44(extraout_var_10,iVar1),i);
    VarSet::VarSet((VarSet *)&local_178,n);
    TFactor<double>::marginal((TFactor<double> *)&v_J,&prod,(VarSet *)&local_178,true);
    TProb<double>::operator=
              ((this->_newmessages).
               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start + iI,&local_120);
    TFactor<double>::~TFactor((TFactor<double> *)&v_J);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_178);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&prod_j);
    TFactor<double>::~TFactor(&prod);
  }
  else {
    if (lVar4 != 1) {
      pEVar6 = (Exception *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&prod,"trw.cpp, line 203",(allocator<char> *)&v_J);
      Exception::Exception(pEVar6,0,(string *)&prod);
      __cxa_throw(pEVar6,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x50))
                      ((long *)CONCAT44(extraout_var_03,iVar1),I);
    TProb<double>::operator=
              ((this->_newmessages).
               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start + iI,(TProb<double> *)(lVar4 + 0x20));
  }
  std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
            ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&v_I);
  return;
}

Assistant:

void TRW::calcNewMessage (size_t iI) {
        // calculate updated message I->i
        size_t i = grm().edge(iI).first;
        size_t I = grm().edge(iI).second;
        Var v_i = grm().var(i);

        VarSet v_I = grm().factor(I).vars();
        if( v_I.size() == 1 ) {
            _newmessages[iI] = grm().factor(I).p();
        } else if( v_I.size() == 2 ) {
            Var v_j = *((v_I / v_i).begin());
            size_t j = grm().findVar( v_j );

            Factor prod = grm().factor(I)^(1.0 / rho(i,j));

            Prob prod_j( v_j.states() );
            for( FactorGraph::nb_cit J = grm().nbV(j).begin(); J != grm().nbV(j).end(); J++ ) {
                VarSet v_J = grm().factor(*J).vars();
                if( v_J.size() == 1 )
                    prod_j *= message(j,*J);
                else if( v_J.size() == 2 ) {
                    Var v_k = *((v_J / v_j).begin());
                    size_t k = grm().findVar( v_k );
                    if( *J == I )
                        prod_j *= message(j,*J)^(rho(j,k) - 1.0);
                    else
                        prod_j *= message(j,*J)^rho(j,k);
                } else
                    DAI_THROW(NOT_IMPLEMENTED);
            }
            prod *= Factor( v_j, prod_j );

            _newmessages[iI] = prod.marginal(grm().var(i)).p();
        } else
            DAI_THROW(NOT_IMPLEMENTED);
    }